

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
* __thiscall
embree::XMLLoader::
loadBinary<std::vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>>>,std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>>>>>>
          (vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
           *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *pXVar1;
  pointer pAVar2;
  long __off;
  size_type __n;
  size_type sVar3;
  runtime_error *prVar4;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->binFile == (FILE *)0x0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_50,(string *)&this->binFileName);
    std::operator+(&local_90,"cannot open file ",&local_50);
    std::operator+(&local_70,&local_90," for reading");
    std::runtime_error::runtime_error(prVar4,(string *)&local_70);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pXVar1 = xml->ptr;
  std::__cxx11::string::string((string *)&local_90,"ofs",(allocator *)&local_50);
  XML::parm(&local_70,pXVar1,&local_90);
  __off = atol(local_70._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  fseek((FILE *)this->binFile,__off,0);
  pXVar1 = xml->ptr;
  std::__cxx11::string::string((string *)&local_90,"size",(allocator *)&local_50);
  XML::parm(&local_70,pXVar1,&local_90);
  __n = atol(local_70._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  if (__n == 0) {
    pXVar1 = xml->ptr;
    std::__cxx11::string::string((string *)&local_90,"num",(allocator *)&local_50);
    XML::parm(&local_70,pXVar1,&local_90);
    __n = atol(local_70._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (__n * 0x30 + __off <= this->binFileSize) {
    std::
    vector<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
    ::vector(__return_storage_ptr__,__n,(allocator_type *)&local_70);
    pAVar2 = (__return_storage_ptr__->
             super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    sVar3 = __fread_chk(pAVar2,0xffffffffffffffff,0x30,
                        ((long)(__return_storage_ptr__->
                               super__Vector_base<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>,_std::allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3<float>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) / 0x30,
                        this->binFile);
    if (__n == sVar3) {
      return __return_storage_ptr__;
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_90,(string *)&this->binFileName);
    std::operator+(&local_70,"error reading from binary file: ",&local_90);
    std::runtime_error::runtime_error(prVar4,(string *)&local_70);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_90,(string *)&this->binFileName);
  std::operator+(&local_70,"error reading from binary file: ",&local_90);
  std::runtime_error::runtime_error(prVar4,(string *)&local_70);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vector XMLLoader::loadBinary(const Ref<XML>& xml)
  {
    if (!binFile) 
      THROW_RUNTIME_ERROR("cannot open file "+binFileName.str()+" for reading");

    size_t ofs = atol(xml->parm("ofs").c_str());
    fseek(binFile,long(ofs),SEEK_SET);

    /* read size of array */
    size_t size = atol(xml->parm("size").c_str());
    if (size == 0) size = atol(xml->parm("num").c_str()); // version for BGF format

    /* perform security check that we stay in the file */
    if (ofs + size*sizeof(typename Vector::value_type) > binFileSize)
      THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());

    /* read data from file */
    Vector data(size);
    if (size != fread(data.data(), sizeof(typename Vector::value_type), data.size(), binFile)) 
      THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());

    return data;
  }